

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O1

void CB_EXPLORE_ADF::predict_or_learn_cover<true>
               (cb_explore_adf *data,multi_learner *base,multi_ex *examples)

{
  pointer *ppfVar1;
  label *this;
  float fVar2;
  float fVar3;
  pointer pfVar4;
  iterator __position;
  action_score *paVar5;
  multi_ex *pmVar6;
  bool bVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  float *__args;
  example *peVar11;
  vector<float,std::allocator<float>> *this_00;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  double __x;
  undefined1 auVar16 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar21;
  undefined1 auVar22 [16];
  double dVar24;
  undefined1 auVar23 [16];
  float fVar25;
  float fVar26;
  float local_d8;
  undefined1 local_c8 [8];
  undefined8 local_c0;
  float local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  multi_ex *local_88;
  vector<float,std::allocator<float>> *local_80;
  long local_78;
  example *local_70;
  v_array<COST_SENSITIVE::label> *local_68;
  v_array<CB::label> *local_60;
  undefined1 local_58 [16];
  pointer_____offset_0x10___ *local_40;
  action_score *local_38;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  if ((data->gen_cs).cb_type == 3) {
    GEN_CS::gen_cs_example_dr<true>(&data->gen_cs,examples,&data->cs_labels);
  }
  else {
    GEN_CS::gen_cs_example<false>(&data->gen_cs,examples,&data->cs_labels);
  }
  LEARNER::multiline_learn_or_predict<true>(base,examples,data->offset,0);
  peVar11 = *(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  uVar14 = (long)(peVar11->pred).scalars._end - (long)(peVar11->pred).scalars._begin >> 3;
  local_b8 = (float)data->cover_size;
  uVar13 = (uint)uVar14;
  uVar14 = uVar14 & 0xffffffff;
  local_a8 = ZEXT416((uint)(float)uVar14);
  lVar8 = data->counter * uVar14;
  auVar22._8_4_ = (int)((ulong)lVar8 >> 0x20);
  auVar22._0_8_ = lVar8;
  auVar22._12_4_ = 0x45300000;
  dVar24 = auVar22._8_8_ - 1.9342813113834067e+25;
  __x = dVar24 + ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0);
  local_88 = examples;
  if (__x < 0.0) {
    auVar16._0_8_ = sqrt(__x);
    auVar16._8_8_ = extraout_XMM0_Qb;
  }
  else {
    auVar16._0_8_ = SQRT(__x);
    auVar16._8_8_ = dVar24;
  }
  auVar17._4_12_ = auVar16._4_12_;
  auVar17._0_4_ = (float)auVar16._0_8_;
  auVar19._12_4_ = auVar16._12_4_;
  auVar19._0_8_ = auVar17._0_8_;
  auVar19._8_4_ = auVar16._4_4_;
  auVar18._8_8_ = auVar19._8_8_;
  auVar18._4_4_ = local_a8._0_4_;
  auVar18._0_4_ = auVar17._0_4_;
  auVar20._0_12_ = auVar18._0_12_;
  auVar20._12_4_ = local_a8._4_4_;
  v_array<ACTION_SCORE::action_score>::clear(&data->action_probs);
  if (uVar13 != 0) {
    uVar12 = 0;
    do {
      local_c8._4_4_ = 0;
      local_c8._0_4_ = uVar12;
      v_array<ACTION_SCORE::action_score>::push_back(&data->action_probs,(action_score *)local_c8);
      uVar12 = uVar12 + 1;
    } while (uVar13 != uVar12);
  }
  pmVar6 = local_88;
  auVar23 = divps(_DAT_002950e0,auVar20);
  pfVar4 = (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar4) {
    (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_finish = pfVar4;
  }
  uStack_90 = auVar23._4_4_;
  local_98 = CONCAT44(uStack_90,uStack_90);
  this_00 = (vector<float,std::allocator<float>> *)&data->scores;
  uStack_8c = uStack_90;
  local_80 = this_00;
  if (uVar13 != 0) {
    lVar8 = 0;
    do {
      __args = (float *)((long)(peVar11->pred).scalars._begin + lVar8 + 4);
      __position._M_current =
           (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  (this_00,__position,__args);
        this_00 = local_80;
      }
      else {
        *__position._M_current = *__args;
        ppfVar1 = &(data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppfVar1 = *ppfVar1 + 1;
      }
      lVar8 = lVar8 + 8;
    } while (uVar14 * 8 - lVar8 != 0);
  }
  fVar25 = 1.0 / local_b8;
  if ((float)local_98 <= auVar23._0_4_) {
    auVar23._0_4_ = (float)local_98;
  }
  if (data->first_only == false) {
    paVar5 = (peVar11->pred).a_s._begin;
    lVar8 = (long)(peVar11->pred).scalars._end - (long)paVar5;
    if (lVar8 == 0) {
      uVar15 = 0;
    }
    else {
      uVar10 = lVar8 >> 3;
      uVar9 = 1;
      uVar15 = uVar9;
      if (1 < uVar10) {
        do {
          uVar15 = uVar9;
          if ((paVar5[uVar9].score != paVar5->score) ||
             (NAN(paVar5[uVar9].score) || NAN(paVar5->score))) break;
          uVar9 = uVar9 + 1;
          uVar15 = uVar10;
        } while (uVar10 != uVar9);
      }
    }
    if (uVar15 != 0) {
      uVar9 = 0;
      do {
        fVar21 = (peVar11->pred).scalars._begin[uVar9 * 2];
        paVar5 = (data->action_probs)._begin;
        paVar5[(uint)fVar21].score = paVar5[(uint)fVar21].score + fVar25 / (float)uVar15;
        uVar9 = uVar9 + 1;
      } while (uVar15 != uVar9);
    }
  }
  else {
    uVar12 = ((peVar11->pred).a_s._begin)->action;
    paVar5 = (data->action_probs)._begin;
    paVar5[uVar12].score = paVar5[uVar12].score + fVar25;
  }
  local_58 = ZEXT416((uint)fVar25);
  bVar7 = CB::ec_is_example_header
                    (*(pmVar6->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                      super__Vector_impl_data._M_start);
  local_d8 = auVar23._0_4_;
  local_a8._0_4_ = (float)local_a8._0_4_ * local_d8;
  if (1 < data->cover_size) {
    fVar25 = ((float)local_58._0_4_ - local_d8) + (float)local_a8._0_4_;
    this = &data->cs_labels_2;
    local_60 = &data->cb_labels;
    local_68 = &data->prepped_cs_labels;
    local_78 = (ulong)bVar7 << 4;
    local_98 = 1;
    uStack_b4 = local_58._4_4_;
    uStack_b0 = local_58._8_4_;
    uStack_ac = local_58._12_4_;
    local_70 = peVar11;
    do {
      local_b8 = fVar25;
      v_array<COST_SENSITIVE::wclass>::clear(&this->costs);
      if (bVar7) {
        v_array<COST_SENSITIVE::wclass>::push_back(&this->costs,(data->cs_labels).costs._begin);
      }
      if (uVar13 != 0) {
        uVar15 = 0;
        lVar8 = local_78;
        do {
          fVar25 = (data->action_probs)._begin[uVar15].score;
          fVar21 = local_d8;
          if (local_d8 <= fVar25) {
            fVar21 = fVar25;
          }
          local_c8._4_4_ = (float)uVar15;
          local_c8._0_4_ =
               *(float *)((long)&((data->cs_labels).costs._begin)->x + lVar8) -
               (data->psi * local_d8) / (fVar21 / local_b8);
          local_c0._0_4_ = 0.0;
          local_c0._4_4_ = 0.0;
          v_array<COST_SENSITIVE::wclass>::push_back(&this->costs,(wclass *)local_c8);
          uVar15 = uVar15 + 1;
          lVar8 = lVar8 + 0x10;
        } while (uVar14 != uVar15);
      }
      local_98 = local_98 + 1;
      GEN_CS::call_cs_ldf<true>
                (data->cs_ldf_learner,local_88,local_60,this,local_68,data->offset,local_98);
      if (uVar13 != 0) {
        uVar15 = 0;
        do {
          *(float *)(*(long *)local_80 + uVar15 * 4) =
               (local_70->pred).a_s._begin[uVar15].score +
               *(float *)(*(long *)local_80 + uVar15 * 4);
          uVar15 = uVar15 + 1;
        } while (uVar14 != uVar15);
      }
      if (data->first_only == false) {
        paVar5 = (local_70->pred).a_s._begin;
        lVar8 = (long)(local_70->pred).scalars._end - (long)paVar5;
        if (lVar8 == 0) {
          uVar15 = 0;
        }
        else {
          uVar10 = lVar8 >> 3;
          uVar9 = 1;
          uVar15 = uVar9;
          if (1 < uVar10) {
            do {
              uVar15 = uVar9;
              if ((paVar5[uVar9].score != paVar5->score) ||
                 (NAN(paVar5[uVar9].score) || NAN(paVar5->score))) break;
              uVar9 = uVar9 + 1;
              uVar15 = uVar10;
            } while (uVar10 != uVar9);
          }
        }
        fVar25 = local_b8;
        if (uVar15 != 0) {
          fVar21 = (float)local_58._0_4_ / (float)uVar15;
          uVar9 = 0;
          do {
            fVar3 = (local_70->pred).scalars._begin[uVar9 * 2];
            paVar5 = (data->action_probs)._begin;
            fVar2 = paVar5[(uint)fVar3].score;
            fVar26 = (fVar2 - local_d8) + fVar21;
            uVar10 = (ulong)fVar26;
            fVar25 = fVar25 + (float)(~-(uint)(fVar2 < local_d8) & (uint)fVar21 |
                                     (uint)(float)((long)(fVar26 - 9.223372e+18) &
                                                   (long)uVar10 >> 0x3f | uVar10) &
                                     -(uint)(fVar2 < local_d8));
            paVar5[(uint)fVar3].score = fVar21 + fVar2;
            uVar9 = uVar9 + 1;
          } while (uVar15 != uVar9);
        }
      }
      else {
        uVar12 = ((local_70->pred).a_s._begin)->action;
        paVar5 = (data->action_probs)._begin;
        fVar25 = paVar5[uVar12].score;
        fVar21 = (fVar25 - local_d8) + (float)local_58._0_4_;
        uVar15 = (ulong)fVar21;
        paVar5[uVar12].score = (float)local_58._0_4_ + fVar25;
        fVar25 = local_b8 +
                 (float)(~-(uint)(fVar25 < local_d8) & local_58._0_4_ |
                        (uint)(float)((long)(fVar21 - 9.223372e+18) & (long)uVar15 >> 0x3f | uVar15)
                        & -(uint)(fVar25 < local_d8));
      }
      peVar11 = local_70;
    } while (local_98 < data->cover_size);
  }
  local_c0 = (data->action_probs)._begin;
  local_38 = (data->action_probs)._end;
  local_c8 = (undefined1  [8])
             &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_40 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  exploration::enforce_minimum_probability<ACTION_SCORE::score_iterator>(data->nounif ^ 1);
  do_sort(data);
  if (uVar14 != 0) {
    uVar15 = 0;
    do {
      *(action_score *)((peVar11->pred).scalars._begin + uVar15 * 2) =
           (data->action_probs)._begin[uVar15];
      uVar15 = uVar15 + 1;
    } while (uVar14 != uVar15);
  }
  data->counter = data->counter + 1;
  return;
}

Assistant:

void predict_or_learn_cover(cb_explore_adf& data, multi_learner& base, multi_ex& examples)
{
  // Randomize over predictions from a base set of predictors
  // Use cost sensitive oracle to cover actions to form distribution.
  const bool is_mtr = data.gen_cs.cb_type == CB_TYPE_MTR;
  if (is_learn)
  {
    if (is_mtr)  // use DR estimates for non-ERM policies in MTR
      GEN_CS::gen_cs_example_dr<true>(data.gen_cs, examples, data.cs_labels);
    else
      GEN_CS::gen_cs_example<false>(data.gen_cs, examples, data.cs_labels);
    multiline_learn_or_predict<true>(base, examples, data.offset);
  }
  else
  {
    GEN_CS::gen_cs_example_ips(examples, data.cs_labels);
    multiline_learn_or_predict<false>(base, examples, data.offset);
  }

  v_array<action_score>& preds = examples[0]->pred.a_s;
  const uint32_t num_actions = (uint32_t)preds.size();

  float additive_probability = 1.f / (float)data.cover_size;
  const float min_prob = min(1.f / num_actions, 1.f / (float)sqrt(data.counter * num_actions));
  v_array<action_score>& probs = data.action_probs;
  probs.clear();
  for (uint32_t i = 0; i < num_actions; i++) probs.push_back({i, 0.});
  data.scores.clear();
  for (uint32_t i = 0; i < num_actions; i++) data.scores.push_back(preds[i].score);

  if (!data.first_only)
  {
    size_t tied_actions = fill_tied(data, preds);
    for (size_t i = 0; i < tied_actions; ++i) probs[preds[i].action].score += additive_probability / tied_actions;
  }
  else
    probs[preds[0].action].score += additive_probability;

  const uint32_t shared = CB::ec_is_example_header(*examples[0]) ? 1 : 0;

  float norm = min_prob * num_actions + (additive_probability - min_prob);
  for (size_t i = 1; i < data.cover_size; i++)
  {
    // Create costs of each action based on online cover
    if (is_learn)
    {
      data.cs_labels_2.costs.clear();
      if (shared > 0)
        data.cs_labels_2.costs.push_back(data.cs_labels.costs[0]);
      for (uint32_t j = 0; j < num_actions; j++)
      {
        float pseudo_cost =
            data.cs_labels.costs[j + shared].x - data.psi * min_prob / (max(probs[j].score, min_prob) / norm);
        data.cs_labels_2.costs.push_back({pseudo_cost, j, 0., 0.});
      }
      GEN_CS::call_cs_ldf<true>(*(data.cs_ldf_learner), examples, data.cb_labels, data.cs_labels_2,
          data.prepped_cs_labels, data.offset, i + 1);
    }
    else
      GEN_CS::call_cs_ldf<false>(
          *(data.cs_ldf_learner), examples, data.cb_labels, data.cs_labels, data.prepped_cs_labels, data.offset, i + 1);

    for (uint32_t i = 0; i < num_actions; i++) data.scores[i] += preds[i].score;
    if (!data.first_only)
    {
      size_t tied_actions = fill_tied(data, preds);
      const float add_prob = additive_probability / tied_actions;
      for (size_t i = 0; i < tied_actions; ++i)
      {
        if (probs[preds[i].action].score < min_prob)
          norm += max(0, add_prob - (min_prob - probs[preds[i].action].score));
        else
          norm += add_prob;
        probs[preds[i].action].score += add_prob;
      }
    }
    else
    {
      uint32_t action = preds[0].action;
      if (probs[action].score < min_prob)
        norm += max(0, additive_probability - (min_prob - probs[action].score));
      else
        norm += additive_probability;
      probs[action].score += additive_probability;
    }
  }

  enforce_minimum_probability(min_prob * num_actions, !data.nounif, begin_scores(probs), end_scores(probs));

  do_sort(data);
  for (size_t i = 0; i < num_actions; i++) preds[i] = probs[i];

  ++data.counter;
}